

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait_example_test.c
# Opt level: O1

void add_and_wait_mu(string_priority_queue_mu *q,nsync_time delay,int n,char **s)

{
  uint uVar1;
  char *__s1;
  char **ppcVar2;
  char *__s2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  
  if (n != 0) {
    uVar4 = 0;
    do {
      __s1 = s[uVar4];
      nsync_mu_lock(&q->mu);
      iVar6 = (q->heap).h_.len_;
      a_ensure_(&q->heap,1,8);
      ppcVar2 = (q->heap).a_;
      iVar3 = (q->heap).h_.len_;
      (q->heap).h_.len_ = iVar3 + 1;
      ppcVar2[iVar3] = __s1;
      if (iVar6 != 0) {
        do {
          uVar1 = iVar6 - 1;
          iVar5 = (int)uVar1 >> 1;
          ppcVar2 = (q->heap).a_;
          __s2 = ppcVar2[iVar5];
          iVar3 = strcmp(__s1,__s2);
          if (-1 < iVar3) break;
          ppcVar2[iVar6] = __s2;
          iVar6 = iVar5;
        } while (1 < uVar1);
      }
      (q->heap).a_[iVar6] = __s1;
      nsync_mu_unlock(&q->mu);
      nsync_time_sleep(delay);
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)n);
  }
  return;
}

Assistant:

static void add_and_wait_mu (string_priority_queue_mu *q,
			     nsync_time delay, int n, const char *s[]) {
	int i;
	for (i = 0; i != n; i++) {
		string_priority_queue_mu_add (q, s[i]);
		nsync_time_sleep (delay);
	}
}